

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefileTargetGenerator.cxx
# Opt level: O0

void __thiscall
cmMakefileTargetGenerator::CreateLinkLibs
          (cmMakefileTargetGenerator *this,cmLinkLineComputer *linkLineComputer,string *linkLibs,
          bool useResponseFile,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *makefile_depends,string *linkLanguage,ResponseFlagFor responseMode)

{
  cmGeneratorTarget *this_00;
  cmLocalUnixMakefileGenerator3 *this_01;
  string_view source;
  cmComputeLinkInformation *pcli_00;
  long lVar1;
  char *__s;
  string local_1c0;
  string local_1a0;
  undefined1 local_180 [8];
  string link_rsp;
  undefined1 local_158 [8];
  string responseLang;
  undefined1 local_130 [8];
  string responseFileName;
  string responseFlag;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  string local_a0;
  cmComputeLinkInformation *local_80;
  cmComputeLinkInformation *pcli;
  string linkPath;
  string frameworkPath;
  string *linkLanguage_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *makefile_depends_local;
  bool useResponseFile_local;
  string *linkLibs_local;
  cmLinkLineComputer *linkLineComputer_local;
  cmMakefileTargetGenerator *this_local;
  
  std::__cxx11::string::string((string *)(linkPath.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)&pcli);
  this_00 = (this->super_cmCommonTargetGenerator).GeneratorTarget;
  GetConfigName_abi_cxx11_(&local_a0,this);
  pcli_00 = cmGeneratorTarget::GetLinkInformation(this_00,&local_a0);
  std::__cxx11::string::~string((string *)&local_a0);
  local_80 = pcli_00;
  cmLocalGenerator::OutputLinkLibraries
            ((cmLocalGenerator *)this->LocalGenerator,pcli_00,linkLineComputer,linkLibs,
             (string *)((long)&linkPath.field_2 + 8),(string *)&pcli);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&responseFlag.field_2 + 8),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&linkPath.field_2 + 8),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&pcli);
  std::operator+(&local_d0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&responseFlag.field_2 + 8),linkLibs);
  std::__cxx11::string::operator=((string *)linkLibs,(string *)&local_d0);
  std::__cxx11::string::~string((string *)&local_d0);
  std::__cxx11::string::~string((string *)(responseFlag.field_2._M_local_buf + 8));
  if ((useResponseFile) &&
     (lVar1 = std::__cxx11::string::find_first_not_of((char)linkLibs,0x20), lVar1 != -1)) {
    GetResponseFlag_abi_cxx11_((string *)((long)&responseFileName.field_2 + 8),this,responseMode);
    __s = "deviceLinkLibs.rsp";
    if (responseMode == Link) {
      __s = "linkLibs.rsp";
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_130,__s,(allocator<char> *)(responseLang.field_2._M_local_buf + 0xf))
    ;
    std::allocator<char>::~allocator((allocator<char> *)(responseLang.field_2._M_local_buf + 0xf));
    link_rsp.field_2._M_local_buf[0xe] = '\0';
    if (responseMode == Link) {
      std::__cxx11::string::string((string *)local_158,(string *)linkLanguage);
    }
    else {
      std::allocator<char>::allocator();
      link_rsp.field_2._M_local_buf[0xe] = '\x01';
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_158,"CUDA",(allocator<char> *)(link_rsp.field_2._M_local_buf + 0xf)
                );
    }
    if ((link_rsp.field_2._M_local_buf[0xe] & 1U) != 0) {
      std::allocator<char>::~allocator((allocator<char> *)(link_rsp.field_2._M_local_buf + 0xf));
    }
    CreateResponseFile((string *)local_180,this,(string *)local_130,linkLibs,makefile_depends,
                       (string *)local_158);
    this_01 = this->LocalGenerator;
    source = (string_view)
             std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_180);
    cmOutputConverter::ConvertToOutputFormat_abi_cxx11_
              (&local_1c0,(cmOutputConverter *)this_01,source,SHELL,false);
    cmStrCat<std::__cxx11::string,std::__cxx11::string>
              (&local_1a0,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               ((long)&responseFileName.field_2 + 8),&local_1c0);
    std::__cxx11::string::operator=((string *)linkLibs,(string *)&local_1a0);
    std::__cxx11::string::~string((string *)&local_1a0);
    std::__cxx11::string::~string((string *)&local_1c0);
    std::__cxx11::string::~string((string *)local_180);
    std::__cxx11::string::~string((string *)local_158);
    std::__cxx11::string::~string((string *)local_130);
    std::__cxx11::string::~string((string *)(responseFileName.field_2._M_local_buf + 8));
  }
  std::__cxx11::string::~string((string *)&pcli);
  std::__cxx11::string::~string((string *)(linkPath.field_2._M_local_buf + 8));
  return;
}

Assistant:

void cmMakefileTargetGenerator::CreateLinkLibs(
  cmLinkLineComputer* linkLineComputer, std::string& linkLibs,
  bool useResponseFile, std::vector<std::string>& makefile_depends,
  std::string const& linkLanguage, ResponseFlagFor responseMode)
{
  std::string frameworkPath;
  std::string linkPath;
  cmComputeLinkInformation* pcli =
    this->GeneratorTarget->GetLinkInformation(this->GetConfigName());
  this->LocalGenerator->OutputLinkLibraries(pcli, linkLineComputer, linkLibs,
                                            frameworkPath, linkPath);
  linkLibs = frameworkPath + linkPath + linkLibs;

  if (useResponseFile &&
      linkLibs.find_first_not_of(' ') != std::string::npos) {
    // Lookup the response file reference flag.
    std::string responseFlag = this->GetResponseFlag(responseMode);

    // Create this response file.
    std::string const responseFileName =
      (responseMode == Link) ? "linkLibs.rsp" : "deviceLinkLibs.rsp";
    std::string const responseLang =
      (responseMode == Link) ? linkLanguage : "CUDA";
    std::string link_rsp = this->CreateResponseFile(
      responseFileName, linkLibs, makefile_depends, responseLang);

    // Reference the response file.
    linkLibs = cmStrCat(std::move(responseFlag),
                        this->LocalGenerator->ConvertToOutputFormat(
                          std::move(link_rsp), cmOutputConverter::SHELL));
  }
}